

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O1

int match_rule(ip_rule_t *ipr,packet_t *pkt)

{
  list_head *plVar1;
  ip_chain_t *piVar2;
  ip_target_t *piVar3;
  _func_int_void_ptr_packet_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar4;
  uint uVar5;
  uint uVar6;
  list_head *plVar7;
  
  iVar4 = match_ip(ipr,pkt);
  uVar6 = 6;
  if (iVar4 != 0) {
    for (plVar7 = (ipr->matchs).next; plVar7 != &ipr->matchs; plVar7 = plVar7->next) {
      if (((plVar7[-1].next != (list_head *)0x0) &&
          (plVar1 = plVar7[-1].next[2].next, plVar1 != (list_head *)0x0)) &&
         (iVar4 = (*(code *)plVar1)(plVar7[-1].prev,pkt), iVar4 == 0)) {
        return 6;
      }
    }
    printf("%s\t: ","match_rule");
    if (0 < match_rule::depth) {
      iVar4 = match_rule::depth + 1;
      do {
        printf("    ");
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    print_rule(ipr);
    uVar6 = ipr->target;
    if (((uVar6 == 4) && (piVar3 = ipr->target_ext, piVar3 != (ip_target_t *)0x0)) &&
       ((piVar3->map != (ip_target_map_t *)0x0 &&
        (UNRECOVERED_JUMPTABLE = piVar3->map->func_target,
        UNRECOVERED_JUMPTABLE != (_func_int_void_ptr_packet_t_ptr *)0x0)))) {
      iVar4 = (*UNRECOVERED_JUMPTABLE)(piVar3->data,pkt);
      return iVar4;
    }
    if ((uVar6 == 5) && (piVar2 = ipr->target_child, piVar2 != (ip_chain_t *)0x0)) {
      match_rule::depth = match_rule::depth + '\x01';
      plVar7 = &piVar2->rules;
      do {
        plVar7 = plVar7->next;
        if (plVar7 == &piVar2->rules) {
LAB_00104413:
          uVar5 = piVar2->policy;
          break;
        }
        uVar5 = match_rule((ip_rule_t *)(plVar7 + -5),pkt);
        if (uVar5 == 3) goto LAB_00104413;
      } while (2 < uVar5);
      match_rule::depth = match_rule::depth + -1;
      if ((uVar5 != 6) || (uVar6 = 3, ipr->go == '\0')) {
        uVar6 = uVar5;
      }
    }
  }
  return uVar6;
}

Assistant:

int match_rule(ip_rule_t *ipr, packet_t *pkt)
{
	static int8_t depth = 0;
	if (!match_ip(ipr, pkt)) {
		return TARGET_NONE;
	}

	ip_match_t *ipm = NULL;
	list_for_each_entry(ipm, &ipr->matchs, list) {
		if (ipm->map && ipm->map->func_match) {
			if (!(ipm->map->func_match(ipm->data, pkt))) {
				return TARGET_NONE;
			}
		}
	}

	printf("%s	: ", __FUNCTION__);
	for (int i = depth; i > 0; printf("    "), i--);
	print_rule(ipr);

	if (ipr->target == TARGET_EXT && ipr->target_ext &&
		ipr->target_ext->map && ipr->target_ext->map->func_target) {
		return ipr->target_ext->map->func_target(ipr->target_ext->data, pkt);
	}

	if (ipr->target == TARGET_CHILD && ipr->target_child) {
		depth++;
		int target = match_chain(ipr->target_child, pkt);
		depth--;
		if (target == TARGET_NONE && ipr->go) {
			return TARGET_RETURN;
		} else {
			return target;
		}
	}

	return ipr->target;
}